

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

bool __thiscall
qpdf::Tokenizer::nextToken(Tokenizer *this,InputSource *input,string *context,size_t max_len)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  byte local_41;
  char local_31;
  long lStack_30;
  char ch;
  qpdf_offset_t offset;
  size_t max_len_local;
  string *context_local;
  InputSource *input_local;
  Tokenizer *this_local;
  
  offset = max_len;
  max_len_local = (size_t)context;
  context_local = (string *)input;
  input_local = (InputSource *)this;
  if (this->state != st_inline_image) {
    reset(this);
  }
  lStack_30 = InputSource::fastTell((InputSource *)context_local);
  while (this->state != st_token_ready) {
    bVar1 = InputSource::fastRead((InputSource *)context_local,&local_31);
    if (bVar1) {
      handleCharacter(this,local_31);
      if ((this->before_token & 1U) != 0) {
        lStack_30 = lStack_30 + 1;
      }
      if ((this->in_token & 1U) != 0) {
        std::__cxx11::string::operator+=((string *)&this->raw_val,local_31);
      }
      if (((offset != 0) && (uVar3 = std::__cxx11::string::length(), (ulong)offset <= uVar3)) &&
         (this->state != st_token_ready)) {
        QTC::TC("qpdf","QPDFTokenizer block long token",0);
        this->type = tt_bad;
        this->state = st_token_ready;
        std::__cxx11::string::operator=
                  ((string *)&this->error_message,"exceeded allowable length while reading token");
      }
    }
    else {
      presentEOF(this);
      if ((this->type == tt_eof) && ((this->allow_eof & 1U) == 0)) {
        this->type = tt_bad;
        std::__cxx11::string::operator=((string *)&this->error_message,"unexpected EOF");
        lStack_30 = InputSource::getLastOffset((InputSource *)context_local);
      }
    }
  }
  local_41 = 0;
  if ((this->in_token & 1U) == 0) {
    local_41 = this->before_token ^ 0xff;
  }
  InputSource::fastUnread((InputSource *)context_local,(bool)(local_41 & 1));
  if (this->type != tt_eof) {
    InputSource::setLastOffset((InputSource *)context_local,lStack_30);
  }
  bVar2 = std::__cxx11::string::empty();
  return (bool)(bVar2 & 1);
}

Assistant:

bool
Tokenizer::nextToken(InputSource& input, std::string const& context, size_t max_len)
{
    if (state != st_inline_image) {
        reset();
    }
    qpdf_offset_t offset = input.fastTell();

    while (state != st_token_ready) {
        char ch;
        if (!input.fastRead(ch)) {
            presentEOF();

            if ((type == tt::tt_eof) && (!allow_eof)) {
                // Nothing in the qpdf library calls readToken without allowEOF anymore, so this
                // case is not exercised.
                type = tt::tt_bad;
                error_message = "unexpected EOF";
                offset = input.getLastOffset();
            }
        } else {
            handleCharacter(ch);
            if (before_token) {
                ++offset;
            }
            if (in_token) {
                raw_val += ch;
            }
            if (max_len && (raw_val.length() >= max_len) && (state != st_token_ready)) {
                // terminate this token now
                QTC::TC("qpdf", "QPDFTokenizer block long token");
                type = tt::tt_bad;
                state = st_token_ready;
                error_message = "exceeded allowable length while reading token";
            }
        }
    }

    input.fastUnread(!in_token && !before_token);

    if (type != tt::tt_eof) {
        input.setLastOffset(offset);
    }

    return error_message.empty();
}